

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O0

int Cec_ManHandleSpecialCases(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  abctime aVar5;
  int v;
  bool bVar6;
  abctime clk;
  int i;
  Gia_Obj_t *pDri2;
  Gia_Obj_t *pDri1;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj1;
  Cec_ParCec_t *pPars_local;
  Gia_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  Gia_ManSetPhase(p);
  clk._4_4_ = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar6 = false;
    if (clk._4_4_ < iVar2) {
      pObj2 = Gia_ManCo(p,clk._4_4_);
      bVar6 = pObj2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      iVar2 = Gia_ManAndNum(p);
      if (iVar2 == 0) {
        if (pPars->fSilent == 0) {
          Abc_Print(1,"Networks are equivalent.  ");
          aVar5 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar5 - aVar4);
        }
        return 1;
      }
      return -1;
    }
    v = clk._4_4_ + 1;
    pObj = Gia_ManPo(p,v);
    iVar2 = Gia_ObjPhase(pObj2);
    iVar3 = Gia_ObjPhase(pObj);
    if (iVar2 != iVar3) {
      if (pPars->fSilent == 0) {
        Abc_Print(1,"Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ",
                  (long)v / 2 & 0xffffffff);
        aVar5 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar5 - aVar4);
      }
      pPars->iOutFail = v / 2;
      Cec_ManTransformPattern(p,v / 2,(int *)0x0);
      return 0;
    }
    pObj_00 = Gia_ObjFanin0(pObj2);
    pObj_01 = Gia_ObjFanin0(pObj);
    iVar2 = Gia_ObjIsPi(p,pObj_00);
    if (((iVar2 != 0) && (iVar2 = Gia_ObjIsPi(p,pObj_01), iVar2 != 0)) && (pObj_00 != pObj_01))
    break;
    iVar2 = Gia_ObjIsPi(p,pObj_00);
    if (((iVar2 != 0) && (iVar2 = Gia_ObjIsConst0(pObj_01), iVar2 != 0)) ||
       ((iVar2 = Gia_ObjIsPi(p,pObj_01), iVar2 != 0 &&
        (iVar2 = Gia_ObjIsConst0(pObj_00), iVar2 != 0)))) {
      if (pPars->fSilent == 0) {
        Abc_Print(1,"Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ",
                  (long)v / 2 & 0xffffffff);
        aVar5 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar5 - aVar4);
      }
      pPars->iOutFail = v / 2;
      Cec_ManTransformPattern(p,v / 2,(int *)0x0);
      iVar2 = Gia_ObjFaninC0(pObj2);
      iVar3 = Gia_ObjFaninC0(pObj);
      if (iVar2 == iVar3) {
        iVar2 = Gia_ObjIsPi(p,pObj_00);
        if (iVar2 == 0) {
          pAVar1 = p->pCexComb;
          iVar2 = Gia_ObjCioId(pObj_01);
          Abc_InfoSetBit((uint *)(pAVar1 + 1),iVar2);
        }
        else {
          pAVar1 = p->pCexComb;
          iVar2 = Gia_ObjCioId(pObj_00);
          Abc_InfoSetBit((uint *)(pAVar1 + 1),iVar2);
        }
        return 0;
      }
      __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCec.c"
                    ,0xc3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
    }
    clk._4_4_ = clk._4_4_ + 2;
  }
  if (pPars->fSilent == 0) {
    Abc_Print(1,"Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ",
              (long)v / 2 & 0xffffffff);
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - aVar4);
  }
  pPars->iOutFail = v / 2;
  Cec_ManTransformPattern(p,v / 2,(int *)0x0);
  iVar2 = Gia_ObjFaninC0(pObj2);
  iVar3 = Gia_ObjFaninC0(pObj);
  if (iVar2 == iVar3) {
    pAVar1 = p->pCexComb;
    iVar2 = Gia_ObjCioId(pObj_00);
    Abc_InfoSetBit((uint *)(pAVar1 + 1),iVar2);
    return 0;
  }
  __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCec.c"
                ,0xb3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
}

Assistant:

int Cec_ManHandleSpecialCases( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    Gia_Obj_t * pObj1, * pObj2;
    Gia_Obj_t * pDri1, * pDri2;
    int i;
    abctime clk = Abc_Clock();
    Gia_ManSetPhase( p );
    Gia_ManForEachPo( p, pObj1, i )
    {
        pObj2 = Gia_ManPo( p, ++i );
        // check if they different on all-0 pattern
        // (for example, when they have the same driver but complemented)
        if ( Gia_ObjPhase(pObj1) != Gia_ObjPhase(pObj2) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            return 0;
        }
        // get the drivers
        pDri1 = Gia_ObjFanin0(pObj1);
        pDri2 = Gia_ObjFanin0(pObj2);
        // drivers are different PIs
        if ( Gia_ObjIsPi(p, pDri1) && Gia_ObjIsPi(p, pDri2) && pDri1 != pDri2 )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // if their compl attributes are the same - one should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            return 0;
        }
        // one of the drivers is a PI; another is a constant 0
        if ( (Gia_ObjIsPi(p, pDri1) && Gia_ObjIsConst0(pDri2)) || 
             (Gia_ObjIsPi(p, pDri2) && Gia_ObjIsConst0(pDri1)) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // the compl attributes are the same - the PI should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            if ( Gia_ObjIsPi(p, pDri1) )
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            else
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri2) );
            return 0;
        }
    }
    if ( Gia_ManAndNum(p) == 0 )
    {
        if ( !pPars->fSilent )
        {
        Abc_Print( 1, "Networks are equivalent.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        return 1;
    }
    return -1;
}